

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void __thiscall
icu_63::UVector::UVector(UVector *this,UObjectDeleter *d,UElementsAreEqual *c,UErrorCode *status)

{
  UElement *pUVar1;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__UVector_003e8fb0;
  this->count = 0;
  this->capacity = 0;
  this->elements = (UElement *)0x0;
  this->deleter = d;
  this->comparer = c;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = (UElement *)uprv_malloc_63(0x40);
    this->elements = pUVar1;
    if (pUVar1 == (UElement *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      this->capacity = 8;
    }
  }
  return;
}

Assistant:

UVector::UVector(UObjectDeleter *d, UElementsAreEqual *c, UErrorCode &status) :
    count(0),
    capacity(0),
    elements(0),
    deleter(d),
    comparer(c)
{
    _init(DEFAULT_CAPACITY, status);
}